

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

void * flatcc_builder_enter_user_frame_ptr(flatcc_builder_t *B,size_t size)

{
  size_t sVar1;
  size_t *__s;
  size_t *frame;
  size_t size_local;
  flatcc_builder_t *B_local;
  
  sVar1 = alignup_size(size,8);
  sVar1 = sVar1 + 8;
  __s = (size_t *)reserve_buffer(B,7,B->user_frame_end,sVar1,0);
  if (__s == (size_t *)0x0) {
    B_local = (flatcc_builder_t *)0x0;
  }
  else {
    memset(__s,0,sVar1);
    B_local = (flatcc_builder_t *)(__s + 1);
    *__s = B->user_frame_offset;
    B->user_frame_offset = B->user_frame_end + 8;
    B->user_frame_end = sVar1 + B->user_frame_end;
  }
  return B_local;
}

Assistant:

void *flatcc_builder_enter_user_frame_ptr(flatcc_builder_t *B, size_t size)
{
    size_t *frame;

    size = alignup_size(size, sizeof(size_t)) + sizeof(size_t);

    if (!(frame = reserve_buffer(B, flatcc_builder_alloc_us, B->user_frame_end, size, 0))) {
        return 0;
    }
    memset(frame, 0, size);
    *frame++ = B->user_frame_offset;
    B->user_frame_offset = B->user_frame_end + sizeof(size_t);
    B->user_frame_end += size;
    return frame;
}